

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O0

MessageBuilder * __thiscall tcu::MessageBuilder::operator<<(MessageBuilder *this,char **value)

{
  char **value_local;
  MessageBuilder *this_local;
  
  std::operator<<((ostream *)&this->m_str,*value);
  return this;
}

Assistant:

inline MessageBuilder& MessageBuilder::operator<< (const T& value)
{
	// Overload stream operator to implement custom format
	m_str << value;
	return *this;
}